

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

bool ON_EvCurvature1Der(ON_3dVector *D1,ON_3dVector *D2,ON_3dVector *D3,ON_3dVector *T,
                       ON_3dVector *K,double *kprime,double *torsion)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  __type _Var7;
  undefined1 local_e8 [8];
  ON_3dVector qprime;
  ON_3dVector local_b8;
  ON_3dVector local_a0;
  double local_88;
  double dsdt2;
  double qlen2;
  ON_3dVector q;
  double local_58;
  double local_50;
  double dsdt;
  bool rc;
  double *kprime_local;
  ON_3dVector *K_local;
  ON_3dVector *T_local;
  ON_3dVector *D3_local;
  ON_3dVector *D2_local;
  ON_3dVector *D1_local;
  
  dsdt._7_1_ = false;
  local_88 = ON_3dVector::Length(D1);
  if (0.0 < local_88) {
    operator*((ON_3dVector *)&q.z,1.0 / local_88,D1);
    T->x = q.z;
    T->y = local_58;
    T->z = local_50;
    ON_CrossProduct((ON_3dVector *)&qlen2,D1,D2);
    dsdt2 = ON_3dVector::LengthSquared((ON_3dVector *)&qlen2);
    local_88 = local_88 * local_88;
    dVar1 = 1.0 / local_88;
    dVar2 = ON_3dVector::operator*(D2,T);
    operator*((ON_3dVector *)&qprime.z,dVar2,T);
    ON_3dVector::operator-(&local_b8,D2,(ON_3dVector *)&qprime.z);
    operator*(&local_a0,dVar1,&local_b8);
    K->x = local_a0.x;
    K->y = local_a0.y;
    K->z = local_a0.z;
    if (kprime != (double *)0x0) {
      ON_CrossProduct((ON_3dVector *)local_e8,D1,D3);
      if (dsdt2 <= 0.0) {
        dVar1 = ON_3dVector::Length((ON_3dVector *)local_e8);
        dVar2 = ON_3dVector::Length(D1);
        _Var7 = std::pow<double,int>(dVar2,3);
        *kprime = dVar1 / _Var7;
      }
      else {
        dVar1 = ON_3dVector::operator*((ON_3dVector *)&qlen2,(ON_3dVector *)local_e8);
        dVar2 = ON_3dVector::LengthSquared(D1);
        dVar3 = dsdt2 * 3.0;
        dVar4 = ON_3dVector::operator*(D1,D2);
        dVar5 = sqrt(dsdt2);
        dVar6 = ON_3dVector::Length(D1);
        dVar6 = pow(dVar6,5.0);
        *kprime = (dVar1 * dVar2 + -(dVar3 * dVar4)) / (dVar5 * dVar6);
      }
      dsdt._7_1_ = true;
    }
    if ((torsion != (double *)0x0) && (dsdt._7_1_ = 0.0 < dsdt2, dsdt._7_1_)) {
      dVar1 = ON_3dVector::operator*((ON_3dVector *)&qlen2,D3);
      *torsion = dVar1 / dsdt2;
    }
  }
  return dsdt._7_1_;
}

Assistant:

bool
ON_EvCurvature1Der(
  const ON_3dVector& D1, // first derivative
  const ON_3dVector& D2, // second derivative
  const ON_3dVector& D3, // third derivative
  ON_3dVector& T,       // Unit tangent returned here
  ON_3dVector& K,       // curvature vector(k*N). curvature k = K.Length() and Normal N=K.Unitize()
  double* kprime,       // first derivative of k
  double* torsion)        // torsion 
{
  bool rc = false;
  double dsdt = D1.Length();
  if (dsdt > 0)
  {
    T = (1 / dsdt) * D1;
    // Differentiate the formula k = | q | / |D1|^3, where q = D1 x D2
    ON_3dVector q = ON_CrossProduct(D1, D2);
    double qlen2 = q.LengthSquared();
    double dsdt2 = dsdt * dsdt;
    K = (1.0/dsdt2)  * (D2 - (D2*T) * T);
    if (kprime)
    {
      ON_3dVector qprime = ON_CrossProduct(D1, D3);
      if (qlen2 > 0)
      {
        *kprime = ((q * qprime) * D1.LengthSquared() - 3 * qlen2 * (D1 * D2)) /
          (sqrt(qlen2) * pow(D1.Length(), 5.0));
      }
      else
        *kprime = qprime.Length() / pow(D1.Length(), 3);
      rc = true;
    }
    if (torsion)
    {
      if (qlen2 > 0)
      {
        *torsion = q * D3 / qlen2;
        rc = true;
      }
      else
        rc = false;
    }
    
  }
  return rc;
}